

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

bool P_MoveThing(AActor *source,DVector3 *pos,bool fog)

{
  bool bVar1;
  AActor *pAVar2;
  undefined1 local_40 [8];
  DVector3 old;
  bool fog_local;
  DVector3 *pos_local;
  AActor *source_local;
  
  old.Z._7_1_ = fog;
  AActor::Pos((DVector3 *)local_40,source);
  AActor::SetOrigin(source,pos,true);
  bVar1 = P_TestMobjLocation(source);
  if (bVar1) {
    if ((old.Z._7_1_ & 1) != 0) {
      P_SpawnTeleportFog(source,pos,false,true);
      P_SpawnTeleportFog(source,(DVector3 *)local_40,true,true);
    }
    AActor::ClearInterpolation(source);
    pAVar2 = TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    if (source == pAVar2) {
      R_ResetViewInterpolation();
    }
    source_local._7_1_ = true;
  }
  else {
    AActor::SetOrigin(source,(DVector3 *)local_40,true);
    source_local._7_1_ = false;
  }
  return source_local._7_1_;
}

Assistant:

bool P_MoveThing(AActor *source, const DVector3 &pos, bool fog)
{
	DVector3 old = source->Pos();

	source->SetOrigin (pos, true);
	if (P_TestMobjLocation (source))
	{
		if (fog)
		{
			P_SpawnTeleportFog(source, pos, false, true);
			P_SpawnTeleportFog(source, old, true, true);
		}
		source->ClearInterpolation();
		if (source == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}
		return true;
	}
	else
	{
		source->SetOrigin (old, true);
		return false;
	}
}